

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZInstPrinter.c
# Opt level: O0

void printU16ImmOperand(MCInst *MI,int OpNum,SStream *O)

{
  cs_detail *pcVar1;
  MCOperand *op;
  ulong uVar2;
  uint8_t *puVar3;
  uint16_t Value;
  SStream *O_local;
  int OpNum_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,OpNum);
  uVar2 = MCOperand_getImm(op);
  if ((ushort)uVar2 < 10) {
    SStream_concat(O,"%u",uVar2 & 0xffff);
  }
  else {
    SStream_concat(O,"0x%x",uVar2 & 0xffff);
  }
  if (MI->csh->detail != CS_OPT_OFF) {
    puVar3 = MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).x86.opcode[0] * 0x20 + 0x16;
    puVar3[0] = '\x02';
    puVar3[1] = '\0';
    puVar3[2] = '\0';
    puVar3[3] = '\0';
    *(ulong *)(MI->flat_insn->detail->groups +
              (ulong)(MI->flat_insn->detail->field_6).x86.opcode[0] * 0x20 + 0x1e) = uVar2 & 0xffff;
    pcVar1 = MI->flat_insn->detail;
    (pcVar1->field_6).x86.opcode[0] = (pcVar1->field_6).x86.opcode[0] + '\x01';
  }
  return;
}

Assistant:

static void printU16ImmOperand(MCInst *MI, int OpNum, SStream *O)
{
	uint16_t Value = (uint16_t)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	// assert(isUInt<16>(Value) && "Invalid u16imm argument");

	if (Value > HEX_THRESHOLD)
		SStream_concat(O, "0x%x", Value);
	else
		SStream_concat(O, "%u", Value);

	if (MI->csh->detail) {
		MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].type = SYSZ_OP_IMM;
		MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].imm = (int64_t)Value;
		MI->flat_insn->detail->sysz.op_count++;
	}
}